

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-driver.c
# Opt level: O0

ztast_t * ztast_from_file(char *filename,char *errbuf)

{
  int iVar1;
  ztlex_t *pzVar2;
  ztslaballoc_t *yyp;
  char *in_RSI;
  ztlexinf_t *info;
  ztlextok_t token;
  ztast_t *ast;
  ztslaballoc_t *slaballoc;
  void *parser;
  ztparseinfo_t parseinfo;
  ztlex_t *lexer;
  ztparseinfo_t *in_stack_ffffffffffffff98;
  ztlex_t *in_stack_ffffffffffffffa0;
  ztlexinf_t **in_stack_ffffffffffffffa8;
  ztlexinf_t *in_stack_ffffffffffffffb0;
  ztast_mallocfn_t *in_stack_ffffffffffffffb8;
  int yymajor;
  char *local_28;
  ztlex_t *local_8;
  
  *in_RSI = '\0';
  pzVar2 = ztlex_from_file((ztlex_mallocfn_t *)in_stack_ffffffffffffffa8,
                           (ztlex_freefn_t *)in_stack_ffffffffffffffa0,
                           (char *)in_stack_ffffffffffffff98);
  if (pzVar2 == (ztlex_t *)0x0) {
    local_8 = (ztlex_t *)0x0;
  }
  else {
    ztparseAlloc((_func_void_ptr_size_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    yyp = ztslaballoc_create();
    if (yyp == (ztslaballoc_t *)0x0) {
      ztparseFree(in_stack_ffffffffffffffa0,(_func_void_void_ptr *)in_stack_ffffffffffffff98);
      local_8 = (ztlex_t *)0x0;
    }
    else {
      local_8 = (ztlex_t *)
                ztast_create(in_stack_ffffffffffffffb8,(ztast_freefn_t *)in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8,(ztast_logfn_t *)in_stack_ffffffffffffffa0);
      if (local_8 != (ztlex_t *)0x0) {
        do {
          iVar1 = ztlex_next_token(local_8,&in_stack_ffffffffffffffb0->line,
                                   in_stack_ffffffffffffffa8);
          yymajor = (int)((ulong)local_8 >> 0x20);
          local_28 = in_RSI;
          if (iVar1 == 0) {
            ztparse(yyp,yymajor,in_stack_ffffffffffffffb0);
            break;
          }
          ztparse(yyp,yymajor,in_stack_ffffffffffffffb0);
        } while (*in_RSI == '\0');
      }
      ztparseFree(in_stack_ffffffffffffffa0,(_func_void_void_ptr *)in_stack_ffffffffffffff98);
      ztlex_destroy(in_stack_ffffffffffffffa0);
      if (*local_28 != '\0') {
        local_8 = (ztlex_t *)0x0;
      }
    }
  }
  return (ztast_t *)local_8;
}

Assistant:

ztast_t *ztast_from_file(const char *filename, char errbuf[ZTMAXERRBUF])
{
  ztlex_t          *lexer;
  ztparseinfo_t     parseinfo;
  void             *parser;
  ztslaballoc_t    *slaballoc;
  ztast_t          *ast;
  ztlextok_t        token;
  const ztlexinf_t *info;

  errbuf[0] = '\0';

  /* Build a lexer */
  lexer = ztlex_from_file(lexer_malloc, lexer_free, filename);
  if (lexer == NULL)
    return NULL;

  /* Allocate a parser */
  parser = ztparseAlloc(parser_malloc, &parseinfo);

  /* Create a memory allocator */
  slaballoc = ztslaballoc_create();
  if (slaballoc == NULL)
  {
    ztparseFree(parser, parser_free);
    return NULL;
  }

  /* Create an AST */
  ast = ztast_create(ztslaballoc, ztslabfree, slaballoc, ztparser_log);
  if (ast == NULL)
    goto stop;

  /* Setup parser */
  parseinfo.ast    = ast;
  parseinfo.errbuf = errbuf;

  /* Uncomment to enable parser debug output */
  /* ztparseTrace(stderr, "ztparse: "); */

  /* Feed the parser one token at a time */
  while (ztlex_next_token(lexer, &token, &info))
  {
    ztparse(parser, token, (ztlexinf_t *) info); /* cast away const for interface */
    if (parseinfo.errbuf[0])
      goto stop;
  }
  ztparse(parser, 0, (ztlexinf_t *) info);

stop:
  ztparseFree(parser, parser_free);
#ifdef ZT_DEBUG
  ztslaballoc_spew(slaballoc);
#endif
  ztlex_destroy(lexer);

  return (parseinfo.errbuf[0] == '\0') ? ast : NULL;
}